

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

void qt_span_clip(int count,QT_FT_Span *spans,void *userData)

{
  int iVar1;
  QT_FT_Span *spans_00;
  QT_FT_Span_ *pQVar2;
  long in_RDX;
  QT_FT_Span *in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  QClipData *unaff_retaddr;
  QT_FT_Span *end;
  QClipData *newClip;
  ClipData *clipData;
  QT_FT_Span *newspans;
  int currentClip;
  QT_FT_Span *in_stack_ffffffffffffffb8;
  QT_FT_Span *pQVar3;
  QClipData *in_stack_ffffffffffffffc0;
  long lVar4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar5;
  QClipData *clip;
  
  clip = *(QClipData **)(in_FS_OFFSET + 0x28);
  iVar1 = *(int *)(in_RDX + 0x10);
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      QClipData::appendSpans(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,1);
    }
    else if (iVar1 == 2) {
      lVar4 = *(long *)(in_RDX + 8);
      QClipData::initialize(unaff_retaddr);
      uVar5 = 0;
      pQVar3 = in_RSI + in_EDI;
      while (in_RSI < pQVar3) {
        spans_00 = (QT_FT_Span *)(*(long *)(lVar4 + 0x18) + (long)*(int *)(lVar4 + 0x14) * 0x10);
        in_RSI = qt_intersect_spans(clip,(int *)CONCAT44(uVar5,in_stack_fffffffffffffff0),spans_00,
                                    (QT_FT_Span *)CONCAT44(in_EDI,in_stack_ffffffffffffffe0),
                                    (QT_FT_Span **)in_RSI,(int)((ulong)in_RDX >> 0x20));
        *(int *)(lVar4 + 0x14) = (int)((long)spans_00 - *(long *)(lVar4 + 0x18) >> 4);
        if (in_RSI < pQVar3) {
          realloc(*(void **)(lVar4 + 0x18),(long)(*(int *)(lVar4 + 0x10) << 1) << 4);
          pQVar2 = q_check_ptr<QT_FT_Span_>((QT_FT_Span_ *)0x565780);
          *(QT_FT_Span_ **)(lVar4 + 0x18) = pQVar2;
          *(int *)(lVar4 + 0x10) = *(int *)(lVar4 + 0x10) << 1;
        }
      }
    }
  }
  if (*(QClipData **)(in_FS_OFFSET + 0x28) != clip) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qt_span_clip(int count, const QT_FT_Span *spans, void *userData)
{
    ClipData *clipData = reinterpret_cast<ClipData *>(userData);

//     qDebug() << " qt_span_clip: " << count << clipData->operation;
//     for (int i = 0; i < qMin(count, 10); ++i) {
//         qDebug() << "    " << spans[i].x << spans[i].y << spans[i].len << spans[i].coverage;
//     }

    switch (clipData->operation) {

    case Qt::IntersectClip:
        {
            QClipData *newClip = clipData->newClip;
            newClip->initialize();

            int currentClip = 0;
            const QT_FT_Span *end = spans + count;
            while (spans < end) {
                QT_FT_Span *newspans = newClip->m_spans + newClip->count;
                spans = qt_intersect_spans(clipData->oldClip, &currentClip, spans, end,
                                           &newspans, newClip->allocated - newClip->count);
                newClip->count = newspans - newClip->m_spans;
                if (spans < end) {
                    newClip->m_spans = q_check_ptr((QT_FT_Span *)realloc(newClip->m_spans, newClip->allocated * 2 * sizeof(QT_FT_Span)));
                    newClip->allocated *= 2;
                }
            }
        }
        break;

    case Qt::ReplaceClip:
        clipData->newClip->appendSpans(spans, count);
        break;
    case Qt::NoClip:
        break;
    }
}